

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O3

void ihevc_inter_pred_chroma_copy
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < ht) {
    uVar1 = 1;
    if (1 < wd * 2) {
      uVar1 = (ulong)(uint)(wd * 2);
    }
    iVar2 = 0;
    do {
      if (0 < wd) {
        uVar3 = 0;
        do {
          pu1_dst[uVar3] = pu1_src[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      pu1_src = pu1_src + src_strd;
      pu1_dst = pu1_dst + dst_strd;
      iVar2 = iVar2 + 1;
    } while (iVar2 != ht);
  }
  return;
}

Assistant:

void ihevc_inter_pred_chroma_copy(UWORD8 *pu1_src,
                                  UWORD8 *pu1_dst,
                                  WORD32 src_strd,
                                  WORD32 dst_strd,
                                  WORD8 *pi1_coeff,
                                  WORD32 ht,
                                  WORD32 wd)
{
    WORD32 row, col;
    UNUSED(pi1_coeff);
    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < 2 * wd; col++)
        {
            pu1_dst[col] = pu1_src[col];
        }

        pu1_src += src_strd;
        pu1_dst += dst_strd;
    }
}